

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall
ON_ObjRef::SetParentIRef
          (ON_ObjRef *this,ON_InstanceRef *iref,ON_UUID iref_id,int idef_geometry_index)

{
  ON_Geometry *pOVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  ON_Brep *pOVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  ON_Geometry *pOVar7;
  undefined4 extraout_var_01;
  ON_Mesh *this_00;
  ON_MeshComponentRef *proxy1;
  ON_ObjRef_IRefID *pOVar8;
  bool bVar9;
  bool local_1e5;
  ON_Xform local_1c8;
  ON_ObjRef_IRefID *local_148;
  ON_ObjRef_IRefID *this_ref;
  ON_Xform geometry_xform;
  ON_Geometry *proxy_component;
  ON_Mesh *proxy_mesh;
  ON_Mesh *local_a0;
  ON_Mesh *parent_mesh;
  ON_Geometry *local_90;
  ON_Geometry *brep_component;
  ON_Brep *proxy_brep;
  ON_COMPONENT_INDEX local_78;
  ON_Brep *local_70;
  ON_Brep *parent_brep;
  ON_SubD *subd;
  ON_Mesh *mesh;
  ON_Brep *brep;
  ON_Geometry *proxy_geo_1;
  ON_Geometry *local_40;
  ON_Geometry *proxy_geo;
  bool rc;
  ON_InstanceRef *pOStack_30;
  int idef_geometry_index_local;
  ON_InstanceRef *iref_local;
  ON_ObjRef *this_local;
  undefined2 uStack_18;
  undefined2 uStack_16;
  ON_UUID iref_id_local;
  
  iref_id_local._0_8_ = iref_id.Data4;
  register0x00000010 = iref_id._0_8_;
  proxy_geo._3_1_ = 0;
  proxy_geo._4_4_ = idef_geometry_index;
  pOStack_30 = iref;
  iref_local = (ON_InstanceRef *)this;
  iVar4 = ON_SimpleArray<ON_ObjRef_IRefID>::Count(&this->m__iref);
  if (iVar4 < 1) {
    if ((this->m_component_index).m_type == invalid_type) {
      bVar9 = true;
      if ((this->m__proxy1 == (ON_Object *)0x0) &&
         (bVar9 = true, this->m__proxy2 == (ON_Object *)0x0)) {
        bVar9 = this->m__proxy_ref_count != (int *)0x0;
      }
      if ((bVar9) &&
         ((((this->m__proxy1 == (ON_Object *)0x0 || (this->m__proxy2 != (ON_Object *)0x0)) ||
           (this->m__proxy_ref_count == (int *)0x0)) ||
          (((*this->m__proxy_ref_count != 1 ||
            (this->m__proxy1 == &this->m_geometry->super_ON_Object)) ||
           (pOVar6 = ON_Brep::Cast(&this->m_geometry->super_ON_Object), pOVar6 == (ON_Brep *)0x0))))
         )) {
        return false;
      }
      if (this->m_geometry == (ON_Geometry *)0x0) {
        return false;
      }
      iVar4 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
      proxy_geo_1 = (ON_Geometry *)CONCAT44(extraout_var,iVar4);
      if (iVar4 != 0) {
        return false;
      }
      if ((this->m_parent_geometry != (ON_Geometry *)0x0) &&
         (this->m_geometry != this->m_parent_geometry)) {
        return false;
      }
      brep = (ON_Brep *)ON_Geometry::Duplicate(this->m_geometry);
      uVar5 = (*(brep->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                        (brep,&pOStack_30->m_xform);
      if ((uVar5 & 1) == 0) {
        if (brep != (ON_Brep *)0x0) {
          (*(brep->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        return false;
      }
      iVar4 = ON_Xform::IsSimilarity(&pOStack_30->m_xform);
      if (iVar4 == -1) {
        iVar4 = (*(brep->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0xc])();
        if (iVar4 == 0x10) {
          mesh = (ON_Mesh *)ON_Brep::Cast((ON_Object *)brep);
          if (mesh != (ON_Mesh *)0x0) {
            ON_Brep::Flip((ON_Brep *)mesh);
          }
        }
        else if (iVar4 == 0x20) {
          subd = (ON_SubD *)ON_Mesh::Cast((ON_Object *)brep);
          if ((ON_Mesh *)subd != (ON_Mesh *)0x0) {
            ON_Mesh::Flip((ON_Mesh *)subd);
          }
        }
        else if ((iVar4 == 0x40000) &&
                (parent_brep = (ON_Brep *)ON_SubD::Cast((ON_Object *)brep),
                parent_brep != (ON_Brep *)0x0)) {
          ON_SubD::ReverseOrientation((ON_SubD *)parent_brep);
        }
      }
      SetProxy(this,(ON_Object *)0x0,(ON_Object *)brep,true);
      this->m_geometry = &brep->super_ON_Geometry;
      this->m_parent_geometry = &brep->super_ON_Geometry;
      proxy_geo._3_1_ = 1;
    }
    else {
      if (this->m__proxy2 != (ON_Object *)0x0) {
        return false;
      }
      local_70 = ON_BrepParent(this->m_parent_geometry);
      if (local_70 == (ON_Brep *)0x0) {
        local_70 = ON_BrepParent(this->m_geometry);
      }
      if (local_70 == (ON_Brep *)0x0) {
        local_a0 = ON_MeshParent(this->m_parent_geometry);
        if (local_a0 == (ON_Mesh *)0x0) {
          local_a0 = ON_MeshParent(this->m_geometry);
        }
        if (local_a0 != (ON_Mesh *)0x0) {
          bVar9 = ON_COMPONENT_INDEX::IsMeshComponentIndex(&this->m_component_index);
          if (!bVar9) {
            return false;
          }
          iVar4 = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
          proxy_mesh = (ON_Mesh *)CONCAT44(extraout_var_01,iVar4);
          bVar9 = ON_COMPONENT_INDEX::operator!=
                            ((ON_COMPONENT_INDEX *)&proxy_mesh,&this->m_component_index);
          if (bVar9) {
            return false;
          }
          this_00 = ON_Mesh::Duplicate(local_a0);
          uVar5 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                            (this_00,&pOStack_30->m_xform);
          if ((uVar5 & 1) == 0) {
            if (this_00 != (ON_Mesh *)0x0) {
              (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
            }
            return false;
          }
          geometry_xform.m_xform[3][3] = *(double *)&this->m_component_index;
          proxy1 = ON_Mesh::MeshComponent(this_00,(ON_COMPONENT_INDEX)geometry_xform.m_xform[3][3]);
          if (proxy1 == (ON_MeshComponentRef *)0x0) {
            if (this_00 != (ON_Mesh *)0x0) {
              (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
            }
            return false;
          }
          this->m_geometry = &proxy1->super_ON_Geometry;
          this->m_parent_geometry = &this_00->super_ON_Geometry;
          SetProxy(this,(ON_Object *)proxy1,(ON_Object *)this_00,true);
          proxy_geo._3_1_ = 1;
        }
      }
      else {
        local_1e5 = false;
        if ((((this->m__proxy1 != (ON_Object *)0x0) &&
             (local_1e5 = false, this->m__proxy2 == (ON_Object *)0x0)) &&
            (local_1e5 = false, this->m__proxy_ref_count != (int *)0x0)) &&
           ((local_1e5 = false, *this->m__proxy_ref_count == 1 &&
            (local_1e5 = false, this->m__proxy1 != &this->m_geometry->super_ON_Object)))) {
          local_78.m_type = (*(this->m_geometry->super_ON_Object)._vptr_ON_Object[0x22])();
          local_78.m_index = extraout_var_00;
          local_1e5 = ON_COMPONENT_INDEX::IsBrepComponentIndex(&local_78);
        }
        if ((local_1e5 == false) &&
           ((this->m__proxy1 != (ON_Object *)0x0 || (this->m__proxy_ref_count != (int *)0x0)))) {
          return false;
        }
        if (((ON_Brep *)this->m_parent_geometry != local_70) &&
           (this->m_parent_geometry != (ON_Geometry *)0x0)) {
          return false;
        }
        pOVar1 = this->m_geometry;
        proxy_brep = *(ON_Brep **)&this->m_component_index;
        pOVar7 = ON_Brep::BrepComponent(local_70,(ON_COMPONENT_INDEX)proxy_brep);
        if (pOVar1 != pOVar7) {
          return false;
        }
        brep_component = &ON_Brep::Duplicate(local_70)->super_ON_Geometry;
        uVar5 = (*(((ON_Brep *)brep_component)->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                  [0x1c])(brep_component,&pOStack_30->m_xform);
        if ((uVar5 & 1) == 0) {
          if (brep_component != (ON_Geometry *)0x0) {
            (*(brep_component->super_ON_Object)._vptr_ON_Object[4])();
          }
          return false;
        }
        parent_mesh = *(ON_Mesh **)&this->m_component_index;
        local_90 = ON_Brep::BrepComponent((ON_Brep *)brep_component,(ON_COMPONENT_INDEX)parent_mesh)
        ;
        if (local_90 == (ON_Geometry *)0x0) {
          return false;
        }
        SetProxy(this,(ON_Object *)0x0,&brep_component->super_ON_Object,true);
        this->m_geometry = local_90;
        this->m_parent_geometry = brep_component;
        proxy_geo._3_1_ = 1;
      }
    }
  }
  else {
    if (((this->m__proxy2 == (ON_Object *)0x0) || (this->m__proxy_ref_count == (int *)0x0)) ||
       (*this->m__proxy_ref_count < 1)) {
      return false;
    }
    local_40 = ON_Geometry::Cast(this->m__proxy2);
    if (local_40 == (ON_Geometry *)0x0) {
      return false;
    }
    uVar5 = (*(local_40->super_ON_Object)._vptr_ON_Object[0x1c])(local_40,&pOStack_30->m_xform);
    if ((uVar5 & 1) == 0) {
      return false;
    }
    proxy_geo._3_1_ = 1;
  }
  if ((proxy_geo._3_1_ & 1) != 0) {
    memcpy(&this_ref,&ON_Xform::IdentityTransformation,0x80);
    iVar4 = ON_SimpleArray<ON_ObjRef_IRefID>::Count(&this->m__iref);
    if (0 < iVar4) {
      pOVar8 = ON_SimpleArray<ON_ObjRef_IRefID>::Last(&this->m__iref);
      memcpy(&this_ref,&pOVar8->m_geometry_xform,0x80);
    }
    local_148 = ON_SimpleArray<ON_ObjRef_IRefID>::AppendNew(&this->m__iref);
    (local_148->m_iref_uuid).Data1 = this_local._4_4_;
    (local_148->m_iref_uuid).Data2 = uStack_18;
    (local_148->m_iref_uuid).Data3 = uStack_16;
    *(undefined8 *)(local_148->m_iref_uuid).Data4 = iref_id_local._0_8_;
    memcpy(&local_148->m_iref_xform,&pOStack_30->m_xform,0x80);
    uVar2 = (pOStack_30->m_instance_definition_uuid).Data2;
    uVar3 = (pOStack_30->m_instance_definition_uuid).Data3;
    (local_148->m_idef_uuid).Data1 = (pOStack_30->m_instance_definition_uuid).Data1;
    (local_148->m_idef_uuid).Data2 = uVar2;
    (local_148->m_idef_uuid).Data3 = uVar3;
    *(undefined8 *)(local_148->m_idef_uuid).Data4 =
         *(undefined8 *)(pOStack_30->m_instance_definition_uuid).Data4;
    local_148->m_idef_geometry_index = proxy_geo._4_4_;
    ON_Xform::operator*(&local_1c8,&pOStack_30->m_xform,(ON_Xform *)&this_ref);
    memcpy(&local_148->m_geometry_xform,&local_1c8,0x80);
    uVar2 = (local_148->m_iref_uuid).Data2;
    uVar3 = (local_148->m_iref_uuid).Data3;
    (this->m_uuid).Data1 = (local_148->m_iref_uuid).Data1;
    (this->m_uuid).Data2 = uVar2;
    (this->m_uuid).Data3 = uVar3;
    *(undefined8 *)(this->m_uuid).Data4 = *(undefined8 *)(local_148->m_iref_uuid).Data4;
  }
  return (bool)(proxy_geo._3_1_ & 1);
}

Assistant:

bool ON_ObjRef::SetParentIRef( const ON_InstanceRef& iref,
                               ON_UUID iref_id,
                               int idef_geometry_index
                               )
{
  bool rc = false;

  if ( m__iref.Count() > 0 )
  {
    // nested irefs
    if (    0 == m__proxy2
         || 0 == m__proxy_ref_count 
         || *m__proxy_ref_count <= 0 )
    {
      return false;
    }
    ON_Geometry* proxy_geo = ON_Geometry::Cast(m__proxy2);
    if ( !proxy_geo )
      return false;
    if ( !proxy_geo->Transform(iref.m_xform) )
      return false;
    rc = true;
  }
  else if ( ON_COMPONENT_INDEX::invalid_type == m_component_index.m_type )
  {
    // handle top level objects    
    while ( m__proxy1 || m__proxy2 || m__proxy_ref_count )
    {
      // It it's an brep proxy for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && 0 != ON_Brep::Cast(m_geometry)
           )
      {
        // 13 July 2011 - Part of the fix for bug 87827
        // is to break here instead of returning false
        // because we have something like a brep proxy 
        // of an extrusion.
        break;        
      }
      return false;
    }

    if ( !m_geometry )
    {
      return false;
    }
    if ( m_geometry->ComponentIndex().m_type != ON_COMPONENT_INDEX::invalid_type )
    {
      return false;
    }
    if ( m_parent_geometry && m_geometry != m_parent_geometry )
    {
      return false;
    }
    ON_Geometry* proxy_geo = m_geometry->Duplicate();
    if ( !proxy_geo->Transform(iref.m_xform) )
    {
      delete proxy_geo;
      return false;
    }

    // 24 June 2024, Mikko, RH-82669:
    // Flip brep/mesh/SubD if the xform is orientation reversing.
    if (-1 == iref.m_xform.IsSimilarity())
    {
      switch (proxy_geo->ObjectType())
      {
      case ON::object_type::brep_object:
      {
        ON_Brep* brep = ON_Brep::Cast(proxy_geo);
        if (0 != brep)
          brep->Flip();
      }
      break;

      case ON::object_type::mesh_object:
      {
        ON_Mesh* mesh = ON_Mesh::Cast(proxy_geo);
        if (0 != mesh)
          mesh->Flip();
      }
      break;

      case ON::object_type::subd_object:
      {
        ON_SubD* subd = ON_SubD::Cast(proxy_geo);
        if (0 != subd)
          subd->ReverseOrientation();
      }
      break;

      default:
        break;
      }
    }

    // 13 July 2011 - Part of the fix for bug 87827
    // was to put the m_geometry and m_parent_geometry
    // assignments after the call to SetProxy() which
    // was zeroing m_geometry and m_parent_geometry.
    SetProxy(0,proxy_geo,true);
    m_geometry = proxy_geo;
    m_parent_geometry = proxy_geo;
    rc = true;
  }
  else
  {
    // handle brep and mesh subobjects
    // create proxy object
    if ( m__proxy2 )
      return false;

    const ON_Brep* parent_brep = ON_BrepParent(m_parent_geometry);
    if ( !parent_brep)
      parent_brep = ON_BrepParent(m_geometry);
    if ( parent_brep )
    {
      // handle breps and their parts

      // 6 June 2013, Mikko, RH-9846:
      // This is a near facsimile of the 87827 fix above.
      // If it's a brep proxy component for an extrusion object, then keep going.
      if (    0 != m__proxy1
           && 0 == m__proxy2 
           && 0 != m__proxy_ref_count 
           && 1 == *m__proxy_ref_count 
           && m__proxy1 != m_geometry
           && m_geometry->ComponentIndex().IsBrepComponentIndex()
           )
      {
        // brep proxy component for an extrusion object, keep going
      }
      else
      if ( m__proxy1 || m__proxy_ref_count )
      {
        return false;
      }
      if ( m_parent_geometry != parent_brep && 0 != m_parent_geometry )
      {
        return false;
      }
      if ( m_geometry != parent_brep->BrepComponent(m_component_index) )
      {
        return false;
      }
      ON_Brep* proxy_brep = parent_brep->Duplicate();
      if ( !proxy_brep->Transform(iref.m_xform) )
      {
        delete proxy_brep;
        return false;
      }
      const ON_Geometry* brep_component = proxy_brep->BrepComponent(m_component_index);
      if ( !brep_component )
      {
        delete brep_component;
        return false;
      }
      SetProxy(0,proxy_brep,true);
      m_geometry        = brep_component;
      m_parent_geometry = proxy_brep;
      rc = true;
    }
    else
    {
      const ON_Mesh* parent_mesh = ON_MeshParent(m_parent_geometry);
      if ( !parent_mesh)
        parent_mesh = ON_MeshParent(m_geometry);
      if ( parent_mesh  )
      {
        // handle meshes and their parts
        if ( m_component_index.IsMeshComponentIndex() )
        {
          if ( m_geometry->ComponentIndex() != m_component_index )
            return false;
          ON_Mesh* proxy_mesh = parent_mesh->Duplicate();
          if ( !proxy_mesh->Transform(iref.m_xform) )
          {
            delete proxy_mesh;
            return false;
          }
          ON_Geometry* proxy_component = proxy_mesh->MeshComponent(m_component_index);
          if( !proxy_component )
          {
            delete proxy_mesh;
            return false;
          }
          m_geometry = proxy_component;
          m_parent_geometry = proxy_mesh;
          SetProxy(proxy_component,proxy_mesh,true);
          rc = true;
        }
        else
        {
          return false;
        }
      }
    }
  }

  if ( rc )
  {
    // This is a valid reference to a piece of geometry
    // in an instance definition.

    ON_Xform geometry_xform(ON_Xform::IdentityTransformation);
    if ( m__iref.Count() > 0 )
      geometry_xform = m__iref.Last()->m_geometry_xform;

    ON_ObjRef_IRefID& this_ref     = m__iref.AppendNew();
    this_ref.m_iref_uuid           = iref_id;
    this_ref.m_iref_xform          = iref.m_xform;
    this_ref.m_idef_uuid           = iref.m_instance_definition_uuid;
    this_ref.m_idef_geometry_index = idef_geometry_index;
    this_ref.m_geometry_xform      = iref.m_xform*geometry_xform;

    m_uuid = this_ref.m_iref_uuid;
  }

  return rc;
}